

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-naming.h
# Opt level: O2

void wabt::RenameToIdentifier
               (string *name,Index i,BindingHash *bh,
               set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
               *filter)

{
  byte bVar1;
  pointer pcVar2;
  size_type sVar3;
  int iVar4;
  ulong uVar5;
  size_type sVar6;
  const_iterator cVar7;
  size_type sVar8;
  byte bVar9;
  uint __val;
  size_type sVar10;
  long lVar11;
  string s;
  ulong local_70;
  string_view word;
  
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  pcVar2 = (name->_M_dataplus)._M_p;
  local_70 = 0;
  sVar3 = name->_M_string_length;
  sVar10 = 1;
  lVar11 = 0;
  do {
    if (sVar10 - sVar3 == 1) {
      if (s._M_string_length != 0) {
        if (s._M_dataplus._M_p[s._M_string_length - 1] == '_') {
          std::__cxx11::string::pop_back();
        }
        if (100 < s._M_string_length) {
          std::__cxx11::string::resize((ulong)&s);
        }
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
      ::_M_erase((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                  *)bh,name);
      __val = 1;
      while( true ) {
        sVar8 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                         *)bh,&s);
        if (sVar8 == 0) break;
        std::__cxx11::string::resize((ulong)&s);
        std::__cxx11::string::push_back((char)&s);
        std::__cxx11::to_string((string *)&word,__val);
        std::__cxx11::string::append((string *)&s);
        std::__cxx11::string::_M_dispose();
        __val = __val + 1;
      }
      std::__cxx11::string::_M_assign((string *)name);
      word.data_ = (char *)0x0;
      word.size_._0_4_ = 0;
      word.size_._4_4_ = 0;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
      ::_M_emplace<std::__cxx11::string&,wabt::Binding>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                  *)bh,&s);
      std::__cxx11::string::_M_dispose();
      return;
    }
    bVar1 = pcVar2[sVar10 - 1];
    lVar11 = (lVar11 + (ulong)(bVar1 == 0x28)) - (ulong)(bVar1 == 0x29);
    if (lVar11 == 0) {
      iVar4 = isalnum((uint)bVar1);
      bVar9 = 0x5f;
      if (iVar4 != 0) {
        bVar9 = bVar1;
      }
      if ((bVar9 != 0x5f) ||
         ((s._M_string_length != 0 && (s._M_dataplus._M_p[s._M_string_length - 1] != '_')))) {
        std::__cxx11::string::push_back((char)&s);
        if ((filter != (set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
                        *)0x0) && ((bVar9 == 0x5f || (sVar10 == name->_M_string_length)))) {
          uVar5 = s._M_string_length - (bVar9 == 0x5f);
          sVar6 = uVar5 - local_70;
          if (uVar5 < local_70 || sVar6 == 0) {
            __assert_fail("word_end > word_start",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/decompiler-naming.h"
                          ,0x44,
                          "void wabt::RenameToIdentifier(std::string &, Index, BindingHash &, const std::set<string_view> *)"
                         );
          }
          word.data_ = s._M_dataplus._M_p + local_70;
          word.size_ = sVar6;
          cVar7 = std::
                  _Rb_tree<wabt::string_view,_wabt::string_view,_std::_Identity<wabt::string_view>,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
                  ::find(&filter->_M_t,&word);
          if ((_Rb_tree_header *)cVar7._M_node != &(filter->_M_t)._M_impl.super__Rb_tree_header) {
            std::__cxx11::string::resize((ulong)&s);
          }
          local_70 = s._M_string_length;
        }
      }
    }
    sVar10 = sVar10 + 1;
  } while( true );
}

Assistant:

inline void RenameToIdentifier(std::string& name, Index i,
                               BindingHash& bh,
                               const std::set<string_view>* filter) {
  // Filter out non-identifier characters, and try to reduce the size of
  // gigantic C++ signature names.
  std::string s;
  size_t nesting = 0;
  size_t read = 0;
  size_t word_start = 0;
  for (auto c : name) {
    read++;
    // We most certainly don't want to parse the entirety of C++ signatures,
    // but these names are sometimes several lines long, so would be great
    // to trim down. One quick way to do that is to remove anything between
    // nested (), which usually means the parameter list.
    if (c == '(') {
      nesting++;
    }
    if (c == ')') {
      nesting--;
    }
    if (nesting) {
      continue;
    }
    if (!isalnum(static_cast<unsigned char>(c))) {
      c = '_';
    }
    if (c == '_') {
      if (s.empty()) {
        continue;  // Skip leading.
      }
      if (s.back() == '_') {
        continue;  // Consecutive.
      }
    }
    s += c;
    if (filter && (c == '_' || read == name.size())) {
      // We found a "word" inside a snake_case identifier.
      auto word_end = s.size();
      if (c == '_') {
        word_end--;
      }
      assert(word_end > word_start);
      auto word = string_view(s.c_str() + word_start, word_end - word_start);
      if (filter->find(word) != filter->end()) {
        s.resize(word_start);
      }
      word_start = s.size();
    }
  }
  if (!s.empty() && s.back() == '_') {
    s.pop_back();  // Trailing.
  }
  // If after all this culling, we're still gigantic (STL identifier can
  // easily be hundreds of chars in size), just cut the identifier
  // down, it will be disambiguated below, if needed.
  const size_t max_identifier_length = 100;
  if (s.size() > max_identifier_length) {
    s.resize(max_identifier_length);
  }
  // Remove original binding first, such that it doesn't match with our
  // new name.
  bh.erase(name);
  // Find a unique name.
  Index disambiguator = 0;
  auto base_len = s.size();
  for (;;) {
    if (bh.count(s) == 0) {
      break;
    }
    disambiguator++;
    s.resize(base_len);
    s += '_';
    s += std::to_string(disambiguator);
  }
  // Replace name in bindings.
  name = s;
  bh.emplace(s, Binding(i));
}